

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.c
# Opt level: O3

void * mraa_iio_event_handler(void *arg)

{
  int __fd;
  iio_event_data data;
  pollfd local_38;
  undefined1 local_30 [16];
  
  __fd = *(int *)((long)arg + 0x14);
  if (-1 < __fd) {
    do {
      local_38.events = 1;
      local_38.fd = __fd;
      poll(&local_38,1,-1);
      read(__fd,local_30,0x10);
      pthread_setcancelstate(1,(int *)0x0);
      (**(code **)((long)arg + 0x28))();
      pthread_setcancelstate(0,(int *)0x0);
      __fd = *(int *)((long)arg + 0x14);
    } while (-1 < __fd);
  }
  pthread_setcancelstate(1,(int *)0x0);
  return (void *)0x0;
}

Assistant:

static void*
mraa_iio_event_handler(void* arg)
{
    struct iio_event_data data;
    mraa_iio_context dev = (mraa_iio_context) arg;

    for (;;) {
        if (mraa_iio_event_poll_nonblock(dev->fp_event, &data) == MRAA_SUCCESS) {
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            dev->isr_event(&data, dev->isr_args);
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
#endif
        } else {
            // we must have got an error code so die nicely
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            return NULL;
        }
    }
}